

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.h
# Opt level: O3

int get_comp_group_idx_context(MACROBLOCKD *xd)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long in_RSI;
  MB_MODE_INFO *above_mi;
  
  uVar3 = 0;
  uVar1 = 0;
  if (in_RSI != 0) {
    if (*(char *)(in_RSI + 0x11) < '\x01') {
      uVar1 = (uint)(*(char *)(in_RSI + 0x10) == '\a') * 3;
    }
    else {
      uVar1 = *(ushort *)(in_RSI + 0xa7) >> 8 & 1;
    }
  }
  if (xd != (MACROBLOCKD *)0x0) {
    if ((char)xd->plane[0].field_0x1 < '\x01') {
      uVar3 = (uint)(xd->plane[0].plane_type == '\a') * 3;
    }
    else {
      uVar3 = *(ushort *)((long)xd->plane[0].seg_dequant_QTX[5] + 3) >> 8 & 1;
    }
  }
  uVar2 = 5;
  if (uVar3 + uVar1 < 5) {
    uVar2 = uVar3 + uVar1;
  }
  return uVar2;
}

Assistant:

static inline int get_comp_group_idx_context(const MACROBLOCKD *xd) {
  const MB_MODE_INFO *const above_mi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mi = xd->left_mbmi;
  int above_ctx = 0, left_ctx = 0;

  if (above_mi) {
    if (has_second_ref(above_mi))
      above_ctx = above_mi->comp_group_idx;
    else if (above_mi->ref_frame[0] == ALTREF_FRAME)
      above_ctx = 3;
  }
  if (left_mi) {
    if (has_second_ref(left_mi))
      left_ctx = left_mi->comp_group_idx;
    else if (left_mi->ref_frame[0] == ALTREF_FRAME)
      left_ctx = 3;
  }

  return AOMMIN(5, above_ctx + left_ctx);
}